

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileFor(jx9_gen_state *pGen)

{
  void *pvVar1;
  char *pcVar2;
  GenBlock *pBlock;
  SyToken *pGen_00;
  sxi32 sVar3;
  sxu32 sVar4;
  VmInstr *pVVar5;
  bool bVar6;
  SyToken *pTmpEnd;
  SyToken *pTmpIn;
  sxu32 n;
  sxu32 nJumpDest;
  VmInstr *pInstr;
  JumpFixup *aPost;
  sxi32 rc;
  sxu32 nLine;
  sxu32 nFalseJump;
  GenBlock *pForBlock;
  SyToken *pEnd;
  SyToken *pPostStart;
  SyToken *pTmp;
  jx9_gen_state *pGen_local;
  
  pForBlock = (GenBlock *)0x0;
  _nLine = (GenBlock *)0x0;
  sVar4 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pTmp = (SyToken *)pGen;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x200) != 0)) {
    pGen->pIn = pGen->pIn + 1;
    jx9DelimitNestedTokens(pGen->pIn,pGen->pEnd,0x200,0x400,(SyToken **)&pForBlock);
    if (((GenBlock *)pTmp[10].pUserData == pForBlock) ||
       ((GenBlock *)pTmp[0xb].sData.zString <= pForBlock)) {
      sVar3 = jx9GenCompileError((jx9_gen_state *)pTmp,1,sVar4,"for: Invalid expression");
      if (sVar3 == -10) {
        pGen_local._4_4_ = -10;
      }
      else {
        pTmp[10].pUserData = pForBlock;
        if (pTmp[10].pUserData < pTmp[0xb].sData.zString) {
          pTmp[10].pUserData = (void *)((long)pTmp[10].pUserData + 0x20);
        }
        pGen_local._4_4_ = 0;
      }
    }
    else {
      pPostStart = (SyToken *)pTmp[0xb].sData.zString;
      pTmp[0xb].sData.zString = (char *)pForBlock;
      sVar3 = jx9CompileExpr((jx9_gen_state *)pTmp,0,
                             (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar3 == -10) {
        pGen_local._4_4_ = -10;
      }
      else {
        if (sVar3 != -3) {
          jx9VmEmitInstr((jx9_vm *)(pTmp->sData).zString,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        }
        pGen_00 = pTmp;
        if ((*(uint *)((long)pTmp[10].pUserData + 0x10) & 0x40000) == 0) {
          sVar3 = jx9GenCompileError((jx9_gen_state *)pTmp,1,
                                     *(sxu32 *)((long)pTmp[10].pUserData + 0x14),
                                     "for: Expected \';\' after initialization expressions");
          if (sVar3 == -10) {
            pGen_local._4_4_ = -10;
          }
          else {
            pGen_local._4_4_ = 0;
          }
        }
        else {
          pTmp[10].pUserData = (void *)((long)pTmp[10].pUserData + 0x20);
          sVar4 = jx9VmInstrLength((jx9_vm *)(pTmp->sData).zString);
          sVar3 = GenStateEnterBlock((jx9_gen_state *)pGen_00,1,sVar4,(void *)0x0,
                                     (GenBlock **)&nLine);
          if (sVar3 == 0) {
            _nLine->bPostContinue = '\x01';
            sVar3 = jx9CompileExpr((jx9_gen_state *)pTmp,0,
                                   (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
            if (sVar3 == -10) {
              pGen_local._4_4_ = -10;
            }
            else {
              if (sVar3 != -3) {
                jx9VmEmitInstr((jx9_vm *)(pTmp->sData).zString,9,0,0,(void *)0x0,(sxu32 *)&rc);
                GenStateNewJumpFixup(_nLine,9,rc);
              }
              if ((*(uint *)((long)pTmp[10].pUserData + 0x10) & 0x40000) == 0) {
                sVar3 = jx9GenCompileError((jx9_gen_state *)pTmp,1,
                                           *(sxu32 *)((long)pTmp[10].pUserData + 0x14),
                                           "for: Expected \';\' after conditionals expressions");
                if (sVar3 == -10) {
                  pGen_local._4_4_ = -10;
                }
                else {
                  pGen_local._4_4_ = 0;
                }
              }
              else {
                pTmp[10].pUserData = (void *)((long)pTmp[10].pUserData + 0x20);
                pEnd = (SyToken *)pTmp[10].pUserData;
                pTmp[10].pUserData = &(pForBlock->aJumpFix).pBase;
                pTmp[0xb].sData.zString = (char *)pPostStart;
                sVar3 = jx9CompileBlock((jx9_gen_state *)pTmp);
                if (sVar3 == -10) {
                  pGen_local._4_4_ = -10;
                }
                else {
                  if ((_nLine->aPostContFix).nUsed != 0) {
                    pvVar1 = (_nLine->aPostContFix).pBase;
                    sVar4 = jx9VmInstrLength((jx9_vm *)(pTmp->sData).zString);
                    for (pTmpIn._0_4_ = 0; (uint)pTmpIn < (_nLine->aPostContFix).nUsed;
                        pTmpIn._0_4_ = (uint)pTmpIn + 1) {
                      pVVar5 = jx9VmGetInstr((jx9_vm *)(pTmp->sData).zString,
                                             *(sxu32 *)((long)pvVar1 + (ulong)(uint)pTmpIn * 8 + 4))
                      ;
                      if (pVVar5 != (VmInstr *)0x0) {
                        pVVar5->iP2 = sVar4;
                      }
                    }
                  }
                  while( true ) {
                    bVar6 = false;
                    if (pEnd < pForBlock) {
                      bVar6 = (pEnd->nType & 0x40000) != 0;
                    }
                    if (!bVar6) break;
                    pEnd = pEnd + 1;
                  }
                  if (pEnd < pForBlock) {
                    pvVar1 = pTmp[10].pUserData;
                    pcVar2 = pTmp[0xb].sData.zString;
                    pTmp[10].pUserData = pEnd;
                    pTmp[0xb].sData.zString = (char *)pForBlock;
                    sVar3 = jx9CompileExpr((jx9_gen_state *)pTmp,0,
                                           (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
                    if (pTmp[10].pUserData < pTmp[0xb].sData.zString) {
                      sVar3 = jx9GenCompileError((jx9_gen_state *)pTmp,1,
                                                 *(sxu32 *)((long)pTmp[10].pUserData + 0x14),
                                                 "for: Expected \')\' after post-expressions");
                      if (sVar3 == -10) {
                        return -10;
                      }
                      return 0;
                    }
                    pTmp[10].pUserData = pvVar1;
                    pTmp[0xb].sData.zString = pcVar2;
                    if (sVar3 == -10) {
                      return -10;
                    }
                    if (sVar3 != -3) {
                      jx9VmEmitInstr((jx9_vm *)(pTmp->sData).zString,0xb,1,0,(void *)0x0,
                                     (sxu32 *)0x0);
                    }
                  }
                  jx9VmEmitInstr((jx9_vm *)(pTmp->sData).zString,8,0,_nLine->nFirstInstr,(void *)0x0
                                 ,(sxu32 *)0x0);
                  pBlock = _nLine;
                  sVar4 = jx9VmInstrLength((jx9_vm *)(pTmp->sData).zString);
                  GenStateFixJumps(pBlock,-1,sVar4);
                  GenStateLeaveBlock((jx9_gen_state *)pTmp,(GenBlock **)0x0);
                  pGen_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            pGen_local._4_4_ = -10;
          }
        }
      }
    }
  }
  else {
    sVar3 = jx9GenCompileError(pGen,1,sVar4,"Expected \'(\' after \'for\' keyword");
    if (sVar3 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileFor(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pPostStart, *pEnd = 0;
	GenBlock *pForBlock = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'for' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'for' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Delimit the init-expr;condition;post-expr */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "for: Invalid expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile initialization expressions if available */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Pop operand lvalues */
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after initialization expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Deffer continue jumps */
	pForBlock->bPostContinue = TRUE;
	/* Compile the condition */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pForBlock, JX9_OP_JZ, nFalseJump);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after conditionals expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Save the post condition stream */
	pPostStart = pGen->pIn;
	/* Compile the loop body */
	pGen->pIn  = &pEnd[1]; /* Jump the trailing parenthesis ')' */
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Fix post-continue jumps */
	if( SySetUsed(&pForBlock->aPostContFix) > 0 ){
		JumpFixup *aPost;
		VmInstr *pInstr;
		sxu32 nJumpDest;
		sxu32 n;
		aPost = (JumpFixup *)SySetBasePtr(&pForBlock->aPostContFix);
		nJumpDest = jx9VmInstrLength(pGen->pVm);
		for( n = 0 ; n < SySetUsed(&pForBlock->aPostContFix) ; ++n ){
			pInstr = jx9VmGetInstr(pGen->pVm, aPost[n].nInstrIdx);
			if( pInstr ){
				/* Fix jump */
				pInstr->iP2 = nJumpDest;
			}
		}
	}
	/* compile the post-expressions if available */
	while( pPostStart < pEnd && (pPostStart->nType & JX9_TK_SEMI) ){
		pPostStart++;
	}
	if( pPostStart < pEnd ){
		SyToken *pTmpIn, *pTmpEnd;
		SWAP_DELIMITER(pGen, pPostStart, pEnd);
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( pGen->pIn < pGen->pEnd ){
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "for: Expected ')' after post-expressions");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}
		RE_SWAP_DELIMITER(pGen);
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY){
			/* Pop operand lvalue */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
}